

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O1

_Bool pool_buffer_set_c_array(chck_pool_buffer *pb,void *items,size_t memb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  _Bool _Var3;
  
  if (memb == 0 || items == (void *)0x0) {
    if (pb != (chck_pool_buffer *)0x0) {
      free(pb->buffer);
      pb->allocated = 0;
      pb->count = 0;
      pb->member = 0;
      pb->used = 0;
      pb->buffer = (uint8_t *)0x0;
      pb->step = 0;
    }
    memb = 0;
LAB_00101175:
    pb->used = pb->allocated;
    pb->count = memb;
    _Var3 = true;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = memb;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pb->member;
    if (SUB168(auVar1 * auVar2,8) == 0) {
      _Var3 = pool_buffer_resize(pb,SUB168(auVar1 * auVar2,0));
      if (_Var3) {
        memcpy(pb->buffer,items,pb->allocated);
        goto LAB_00101175;
      }
    }
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

static bool
pool_buffer_set_c_array(struct chck_pool_buffer *pb, const void *items, size_t memb)
{
   assert(pb);

   if (items && memb > 0) {
      if (!pool_buffer_resize_mul(pb, memb, pb->member))
         return false;

      memcpy(pb->buffer, items, pb->allocated);
   } else {
      pool_buffer_release(pb);
      memb = 0;
   }

   pb->used = pb->allocated;
   pb->count = memb;
   return true;
}